

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void NetworkDataType::
     deserializedata<unsigned_char,unsigned_char,unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
               (binarydata *data,uchar *args,uchar *args_1,unsigned_short *args_2,
               unsigned_short *args_3,unsigned_short *args_4,unsigned_short *args_5,
               unsigned_short *args_6,uchar *args_7,unsigned_short *args_8,uchar *args_9,
               unsigned_short *args_10,unsigned_short *args_11,unsigned_short *args_12,
               unsigned_short *args_13)

{
  Options OVar1;
  _Ios_Openmode _Var2;
  PortableBinaryInputArchive archive;
  stringstream stream;
  binarydata *in_stack_fffffffffffffc88;
  Options *in_stack_fffffffffffffcb0;
  istream *in_stack_fffffffffffffcb8;
  PortableBinaryInputArchive *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 uVar3;
  unsigned_short *in_stack_fffffffffffffce8;
  uchar *in_stack_fffffffffffffcf0;
  uchar *in_stack_fffffffffffffcf8;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_stack_fffffffffffffd00;
  unsigned_short *in_stack_fffffffffffffd40;
  unsigned_short *in_stack_fffffffffffffd48;
  uchar *in_stack_fffffffffffffd50;
  unsigned_short *in_stack_fffffffffffffd58;
  uchar *in_stack_fffffffffffffd60;
  unsigned_short *in_stack_fffffffffffffd68;
  unsigned_short *in_stack_fffffffffffffd70;
  unsigned_short *in_stack_fffffffffffffd78;
  unsigned_short *in_stack_fffffffffffffd80;
  string local_208 [32];
  stringstream local_1e8 [440];
  
  binarydata::operator_cast_to_string(in_stack_fffffffffffffc88);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1e8,local_208,_Var2);
  std::__cxx11::string::~string(local_208);
  OVar1 = cereal::PortableBinaryInputArchive::Options::Default();
  uVar3 = CONCAT13(OVar1.itsInputEndianness,(int3)in_stack_fffffffffffffce4);
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8,(unsigned_short *)CONCAT44(uVar3,_Var2),
             (unsigned_short *)CONCAT17(OVar1.itsInputEndianness,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd58,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,
             in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
  cereal::PortableBinaryInputArchive::~PortableBinaryInputArchive
            ((PortableBinaryInputArchive *)0x212d18);
  std::__cxx11::stringstream::~stringstream(local_1e8);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }